

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O2

int Cec_ManSimCompareEqualFirstBit(uint *p0,uint *p1,int nWords)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  if (0 < nWords) {
    uVar5 = (ulong)(uint)nWords;
  }
  uVar4 = 0;
  if (((*p1 ^ *p0) & 1) == 0) {
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      uVar3 = p0[uVar4];
      uVar2 = p1[uVar4];
      if (uVar3 != uVar2) {
LAB_004cfc91:
        iVar1 = Gia_WordFindFirstBit(uVar2 ^ uVar3);
        return iVar1 + (int)uVar4 * 0x20;
      }
    }
  }
  else {
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      uVar2 = p0[uVar4];
      uVar3 = ~p1[uVar4];
      if (uVar2 != uVar3) goto LAB_004cfc91;
    }
  }
  return -1;
}

Assistant:

int Cec_ManSimCompareEqualFirstBit( unsigned * p0, unsigned * p1, int nWords )
{
    int w;
    if ( (p0[0] & 1) == (p1[0] & 1) )
    {
        for ( w = 0; w < nWords; w++ )
            if ( p0[w] != p1[w] )
                return 32*w + Gia_WordFindFirstBit( p0[w] ^ p1[w] );
        return -1;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( p0[w] != ~p1[w] )
                return 32*w + Gia_WordFindFirstBit( p0[w] ^ ~p1[w] );
        return -1;
    }
}